

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryCompiler.cpp
# Opt level: O2

void __thiscall QueryCompiler::~QueryCompiler(QueryCompiler *this)

{
  pointer ppFVar1;
  Function *pFVar2;
  pointer ppFVar3;
  
  ppFVar1 = (this->_functionList).super__Vector_base<Function_*,_std::allocator<Function_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar3 = (this->_functionList).super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppFVar3 != ppFVar1; ppFVar3 = ppFVar3 + 1
      ) {
    pFVar2 = *ppFVar3;
    if (pFVar2 != (Function *)0x0) {
      std::__cxx11::string::~string((string *)&pFVar2->_name);
    }
    operator_delete(pFVar2);
  }
  std::
  _Hashtable<std::tuple<int,_int,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->_viewCache)._M_h);
  std::
  _Hashtable<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->_cache)._M_h);
  std::_Vector_base<Function_*,_std::allocator<Function_*>_>::~_Vector_base
            (&(this->_functionList).super__Vector_base<Function_*,_std::allocator<Function_*>_>);
  std::_Vector_base<View_*,_std::allocator<View_*>_>::~_Vector_base
            (&(this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>);
  std::_Vector_base<Query_*,_std::allocator<Query_*>_>::~_Vector_base
            (&(this->_queryList).super__Vector_base<Query_*,_std::allocator<Query_*>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

QueryCompiler::~QueryCompiler()
{
    for (Function* f : _functionList)
        delete f;
}